

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

int pzshape::TPZShapeLinear::NConnectShapeF(int side,int order)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  int in_EDI;
  int local_4;
  
  if (in_EDI < 2) {
    local_4 = 1;
  }
  else if (in_EDI < 3) {
    local_4 = in_ESI + -1;
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,
                           "TPZShapeLinear::NConnectShapeF, bad parameter side ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZShapeLinear::NConnectShapeF(int side, int order) {
		if(side<2) return 1;//0 a 4
		if(side<3) return (order-1);//6 a 14
		PZError << "TPZShapeLinear::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}